

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory_computer.h
# Opt level: O2

void __thiscall
directed_flag_complex_in_memory_computer::store_coboundaries_in_cache_t::operator()
          (store_coboundaries_in_cache_t *this,vertex_index_t *first_vertex,int size,
          pair<int,_float> *param_3)

{
  filtered_directed_graph_t *pfVar1;
  compressed_sparse_matrix<entry_t> *this_00;
  uint uVar2;
  ostream *poVar3;
  pair<int,_float> *ppVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  short local_98;
  uint local_90;
  ulong local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vertex_offsets;
  directed_flag_complex_coboundary_cell_t local_50;
  
  if ((this->is_first == true) && ((this->current_index + 1) % 10000 == 0)) {
    poVar3 = std::operator<<((ostream *)&std::cout,"\x1b[K");
    poVar3 = std::operator<<(poVar3,"dimension ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->current_dimension);
    poVar3 = std::operator<<(poVar3,": computed ca. ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    if (this->total_cell_number != 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"/");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    }
    std::operator<<((ostream *)&std::cout," coboundaries");
    poVar3 = (ostream *)std::ostream::flush();
    std::operator<<(poVar3,"\r");
  }
  compressed_sparse_matrix<entry_t>::append_column(this->coboundary_matrix);
  vertex_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vertex_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vertex_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar10 = 0;
  uVar9 = 0;
  if (0 < size) {
    uVar9 = (ulong)(uint)size;
  }
  for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
    local_70 = (ulong)(first_vertex[uVar10] >> 6);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (&vertex_offsets,&local_70);
  }
  for (uVar9 = 0; (long)uVar9 <= (long)size; uVar9 = uVar9 + 1) {
    uVar10 = 0;
    while( true ) {
      pfVar1 = this->graph;
      uVar5 = (pfVar1->super_directed_graph_t).incidence_row_length;
      if (uVar5 <= uVar10) break;
      uVar11 = 0xffffffffffffffff;
      for (uVar7 = 0; (local_90 = (uint)(uVar10 << 6), uVar11 != 0 && ((long)uVar7 < (long)size));
          uVar7 = uVar7 + 1) {
        if (vertex_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_start[uVar7] == uVar10) {
          uVar11 = uVar11 & ~(1L << ((ulong)first_vertex[uVar7] & 0x3f));
        }
        pvVar8 = &(pfVar1->super_directed_graph_t).incidence_incoming;
        if (uVar7 < uVar9) {
          pvVar8 = &(pfVar1->super_directed_graph_t).incidence_outgoing;
        }
        uVar11 = uVar11 & (pvVar8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          )._M_impl.super__Vector_impl_data._M_start
                          [first_vertex[uVar7] * uVar5 + uVar10];
      }
      while (uVar11 != 0) {
        uVar5 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        uVar2 = (uint)uVar5 | local_90;
        local_98 = (short)uVar9;
        uVar6 = uVar2;
        if (local_98 != 0) {
          uVar6 = (uint)*first_vertex;
        }
        uVar7 = this->nb_threads;
        this_00 = this->coboundary_matrix;
        local_50.super_directed_flag_complex_cell_t._vptr_directed_flag_complex_cell_t =
             (_func_int **)&PTR_vertex_0015d258;
        local_50._insert_vertex = (vertex_index_t)uVar2;
        local_50.super_directed_flag_complex_cell_t.vertices = first_vertex;
        local_50._insert_position = uVar9 & 0xffff;
        ppVar4 = directed_flag_complex_in_memory_t<std::pair<int,_float>_>::
                 get_data<directed_flag_complex_coboundary_cell_t>
                           (this->complex,this->current_dimension + 1,&local_50);
        uVar11 = uVar11 & ~(1L << (uVar5 & 0x3f));
        uVar5 = (ulong)(*(int *)&this->modulus - 1U & 0xffff) << 0x20;
        if ((uVar9 & 1) == 0) {
          uVar5 = 0x100000000;
        }
        compressed_sparse_matrix<entry_t>::push_back
                  (this_00,(entry_t)((uint)(ppVar4->first +
                                           (int)(this->cell_index_offsets->
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                )._M_impl.super__Vector_impl_data._M_start
                                                [(short)((ulong)(uVar6 & 0xffff) % uVar7)]) | uVar5)
                  );
      }
      uVar10 = uVar10 + 1;
    }
  }
  this->current_index = this->current_index + 1;
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&vertex_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void operator()(vertex_index_t* first_vertex, int size, std::pair<index_t, value_t>&) {
#ifdef INDICATE_PROGRESS
		if (is_first && (current_index + 1) % 10000 == 0) {
			std::cout << "\033[K"
			          << "dimension " << current_dimension << ": computed ca. " << nb_threads * (current_index + 1);
			if (total_cell_number > 0) std::cout << "/" << total_cell_number;
			std::cout << " coboundaries" << std::flush << "\r";
		}
#endif
		directed_flag_complex_cell_t cell(first_vertex);
		coboundary_matrix.append_column();

		std::vector<size_t> vertex_offsets;
		for (int j = 0; j < size; j++) vertex_offsets.push_back(first_vertex[j] >> 6);

		for (int i = 0; i <= size; i++) {
			// Check intersections in chunks of 64
			for (size_t offset = 0; offset < graph.incidence_row_length; offset++) {
				size_t bits = -1; // All bits set

				for (int j = 0; bits > 0 && j < size; j++) {
					// Remove the vertices already making up the cellk
					if (vertex_offsets[j] == offset) bits &= ~(ONE_ << (first_vertex[j] - (vertex_offsets[j] << 6)));

					// Intersect with the outgoing/incoming edges of the current
					// vertex
					bits &= j < i ? graph.get_outgoing_chunk(first_vertex[j], offset)
					              : graph.get_incoming_chunk(first_vertex[j], offset);
				}

				size_t vertex_offset = offset << 6;
				while (bits > 0) {
					// Get the least significant non-zero bit
					auto b = __builtin_ctzl(bits);

					// Unset this bit
					bits &= ~(ONE_ << b);

					// Now insert the appropriate vertex at this position
					auto cb = cell.insert_vertex(i, vertex_index_t(vertex_offset + b));
					short thread_index = cb.vertex(0) % nb_threads;
					coboundary_matrix.push_back(make_entry(complex.get_data(current_dimension + 1, cb).first +
					                                           index_t(cell_index_offsets[thread_index]),
					                                       index_t(i & 1 ? -1 + modulus : 1)));
				}
			}
		}

		current_index++;
	}